

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode
UA_Server_setVariableNode_valueCallback
          (UA_Server *server,UA_NodeId nodeId,UA_ValueCallback callback)

{
  UA_StatusCode UVar1;
  UA_NodeStoreEntry **ppUVar2;
  UA_Node *pUVar3;
  
  ppUVar2 = findNode(server->nodestore,&nodeId);
  if (ppUVar2 == (UA_NodeStoreEntry **)0x0) {
    pUVar3 = (UA_Node *)0x0;
  }
  else {
    pUVar3 = &(*ppUVar2)->node;
  }
  if (pUVar3 == (UA_Node *)0x0) {
    UVar1 = 0x80340000;
  }
  else {
    UVar1 = 0x805f0000;
    if (pUVar3->nodeClass == UA_NODECLASS_VARIABLE) {
      *(_func_void_void_ptr_UA_NodeId_UA_Variant_ptr_UA_NumericRange_ptr **)
       ((long)(pUVar3 + 2) + 0x18) = callback.onWrite;
      *(void **)((long)(pUVar3 + 2) + 8) = callback.handle;
      *(_func_void_void_ptr_UA_NodeId_UA_Variant_ptr_UA_NumericRange_ptr **)
       ((long)(pUVar3 + 2) + 0x10) = callback.onRead;
      UVar1 = 0;
    }
  }
  return UVar1;
}

Assistant:

UA_StatusCode
UA_Server_setVariableNode_valueCallback(UA_Server *server, const UA_NodeId nodeId,
                                        const UA_ValueCallback callback) {
    UA_RCU_LOCK();
    UA_StatusCode retval = UA_Server_editNode(server, &adminSession, &nodeId,
                                              (UA_EditNodeCallback)setValueCallback, &callback);
    UA_RCU_UNLOCK();
    return retval;
}